

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> * __thiscall
Corrade::Utility::Path::anon_unknown_24::readInternal
          (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>
           *__return_storage_ptr__,anon_unknown_24 *this,StringView filename,size_t extra)

{
  bool bVar1;
  int fd;
  char *pcVar2;
  FILE *__stream;
  Debug *pDVar3;
  int *piVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ostream *output;
  Error *this_00;
  long lVar7;
  ArrayView<char> AVar8;
  StringView value;
  StringView value_00;
  Error err;
  Optional<unsigned_long> size_;
  ScopeGuard exit;
  Array<char,_void_(*)(char_*,_unsigned_long)> out;
  
  value._sizePlusFlags = filename._data;
  this_00 = &err;
  Containers::String::nullTerminatedView((String *)&err,(String *)this,filename);
  pcVar2 = Containers::String::data((String *)&err);
  __stream = fopen(pcVar2,"rb");
  Containers::String::~String((String *)&err);
  if (__stream == (FILE *)0x0) {
    Error::Error(&err,(Flags)0x0);
    pDVar3 = Debug::operator<<(&err.super_Debug,"Utility::Path::read(): can\'t open");
    value_00._sizePlusFlags = (size_t)value._sizePlusFlags;
    value_00._data = (char *)this;
    pDVar3 = Debug::operator<<(pDVar3,value_00);
    (pDVar3->_immediateFlags)._value = (pDVar3->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar3,":");
    piVar4 = __errno_location();
    Implementation::printErrnoErrorString(&err.super_Debug,*piVar4);
    __return_storage_ptr__->_set = false;
    Error::~Error(&err);
  }
  else {
    exit._deleter = fclose;
    exit._deleterWrapper =
         Containers::ScopeGuard::ScopeGuard<_IO_FILE_*,_int_(*)(_IO_FILE_*)>::
         anon_class_1_0_00000001::__invoke;
    exit._handle = __stream;
    fd = fileno(__stream);
    bVar1 = isDirectory(fd);
    if (bVar1) {
      Error::Error(&err,(Flags)0x0);
      pDVar3 = Debug::operator<<(&err.super_Debug,"Utility::Path::read():");
      value._data = (char *)this;
      pDVar3 = Debug::operator<<(pDVar3,value);
      Debug::operator<<(pDVar3,"is a directory");
      Error::~Error(&err);
      __return_storage_ptr__->_set = false;
    }
    else {
      size((anon_unknown_24 *)&size_,(FILE *)__stream);
      if (size_._set == false) {
        err.super_Debug._sourceLocationFile = (char *)0x0;
        err.super_Debug._output = (ostream *)0x0;
        err.super_Debug._flags._value = '\0';
        err.super_Debug._immediateFlags._value = '\0';
        err.super_Debug._internalFlags._value = '\0';
        err.super_Debug._previousColor = Black;
        err.super_Debug._sourceLocationLine = 0;
        lVar7 = filename._sizePlusFlags + 0x1000;
        do {
          AVar8 = Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                            (&err,lVar7);
          sVar6 = fread(AVar8._data,1,0x1000,__stream);
          Containers::arrayRemoveSuffix<char,Corrade::Containers::ArrayMallocAllocator<char>>
                    ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&err,lVar7 - sVar6);
        } while (sVar6 != 0);
        __return_storage_ptr__->_set = true;
        (__return_storage_ptr__->field_0)._value._data = (char *)err.super_Debug._output;
        (__return_storage_ptr__->field_0)._value._size = err.super_Debug._8_8_;
        (__return_storage_ptr__->field_0)._value._deleter =
             (_func_void_char_ptr_unsigned_long *)err.super_Debug._sourceLocationFile;
        err.super_Debug._output = (ostream *)0x0;
        err.super_Debug._flags._value = '\0';
        err.super_Debug._immediateFlags._value = '\0';
        err.super_Debug._internalFlags._value = '\0';
        err.super_Debug._previousColor = Black;
        err.super_Debug._sourceLocationLine = 0;
        err.super_Debug._sourceLocationFile = (char *)0x0;
      }
      else {
        puVar5 = Containers::Optional<unsigned_long>::operator*(&size_);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::Array
                  (&out,filename._sizePlusFlags + *puVar5);
        pcVar2 = out._data;
        puVar5 = Containers::Optional<unsigned_long>::operator*(&size_);
        sVar6 = fread(pcVar2,1,*puVar5,__stream);
        puVar5 = Containers::Optional<unsigned_long>::operator*(&size_);
        pcVar2 = out._data;
        if (*puVar5 < sVar6) {
          output = Error::defaultOutput();
          Error::Error(&err,output,(Flags)0x0);
          Debug::operator<<(&err.super_Debug,
                            "Assertion realSize <= *size_ failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Path.cpp:1143"
                           );
          Error::~Error(&err);
          abort();
        }
        this_00 = (Error *)&out;
        out._deleter = (_func_void_char_ptr_unsigned_long *)0x0;
        out._data = (char *)0x0;
        out._size = 0;
        __return_storage_ptr__->_set = true;
        (__return_storage_ptr__->field_0)._value._data = pcVar2;
        (__return_storage_ptr__->field_0)._value._size = sVar6;
        (__return_storage_ptr__->field_0)._value._deleter = (_func_void_char_ptr_unsigned_long *)0x0
        ;
        err.super_Debug._output = (ostream *)0x0;
        err.super_Debug._flags._value = '\0';
        err.super_Debug._immediateFlags._value = '\0';
        err.super_Debug._internalFlags._value = '\0';
        err.super_Debug._previousColor = Black;
        err.super_Debug._sourceLocationLine = 0;
        err.super_Debug._sourceLocationFile = (char *)0x0;
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&err);
      }
      Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this_00);
    }
    Containers::ScopeGuard::~ScopeGuard(&exit);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::Array<char>> readInternal(const Containers::StringView filename, std::size_t extra) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "rb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"rb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::read(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    Containers::ScopeGuard exit{f, std::fclose};

    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Explicitly fail if opening directories for reading on Unix to prevent
       allocation failures or silent errors, see isDirectory(int) for details.
       On Windows the fopen() fails already. */
    if(isDirectory(fileno(f))) {
        Error{} << "Utility::Path::read():" << filename << "is a directory";
        return {};
    }
    #endif

    Containers::Optional<std::size_t> size_ = size(f);

    /* If the file is not seekable, read it in chunks. Read directly into the
       output array --- each time add uninitialized 4 kB at the end, pass that
       view to fread(), and then strip away what didn't get filled. Hey, do you
       like the growable array API as much as I do? :D */
    /** @todo that the loop works is only verifiable by setting the condition
        to if(true) and setting chunkSize to 1 -- I don't know about any large
        non-seekable file that could be used for this */
    if(!size_) {
        Containers::Array<char> out;
        constexpr std::size_t chunkSize = 4096;

        std::size_t count;
        do {
            count = std::fread(arrayAppend(out, NoInit, chunkSize + extra), 1, chunkSize, f);
            arrayRemoveSuffix(out, chunkSize + extra - count);
        } while(count);

        /* GCC 4.8 needs extra help here */
        return Containers::optional(Utility::move(out));
    }

    /* Some special files report more bytes than they actually have (such as
       stuff in /sys). Clamp the returned array to what was reported. */
    Containers::Array<char> out{NoInit, *size_ + extra};
    const std::size_t realSize = std::fread(out, 1, *size_, f);
    CORRADE_INTERNAL_ASSERT(realSize <= *size_);
    return Containers::Array<char>{out.release(), realSize};
}